

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  byte *pbVar1;
  ImGuiDockContext *this;
  int *piVar2;
  byte bVar3;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar4;
  ImGuiDockRequest *pIVar5;
  uint uVar6;
  ImGuiContext *ctx;
  int iVar7;
  uint uVar8;
  ImGuiDockNode *dst_node;
  long lVar9;
  void *__dest;
  ImGuiWindowSettings *p;
  ushort uVar10;
  uint uVar11;
  ushort uVar12;
  long lVar13;
  void *__src;
  ImGuiDockNode *pIVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  ulong __nmemb;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  uint local_78;
  void *pvStack_70;
  ulong local_60;
  
  ctx = GImGui;
  this = &GImGui->DockContext;
  uVar8 = 0;
  if (root_id == 0) {
    uVar10 = 0;
    dst_node = (ImGuiDockNode *)0x0;
    uVar12 = 0;
  }
  else {
    dst_node = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr(&this->Nodes,root_id);
    if (dst_node == (ImGuiDockNode *)0x0) {
      return;
    }
    uVar10 = *(ushort *)&dst_node->field_0xb8 & 7;
    uVar12 = *(ushort *)&dst_node->field_0xb8 & 0x38;
  }
  local_78 = 0;
  pvStack_70 = (void *)0x0;
  iVar7 = (this->Nodes).Data.Size;
  if (iVar7 < 1) {
    bVar17 = 0;
  }
  else {
    __dest = (void *)0x0;
    __src = (void *)0x0;
    local_60 = 0;
    uVar8 = 0;
    lVar13 = 0;
    bVar17 = 0;
    do {
      src_node = (ImGuiDockNode *)(ctx->DockContext).Nodes.Data.Data[lVar13].field_1.val_p;
      if (src_node != (ImGuiDockNode *)0x0) {
        if (root_id == 0) {
          bVar17 = (*(byte *)((long)&src_node->LocalFlags + 1) & 8) >> 3 | bVar17;
LAB_00139f31:
          uVar11 = (uint)local_60;
          if (uVar8 == uVar11) {
            if (uVar11 == 0) {
              uVar8 = 8;
            }
            else {
              uVar8 = ((int)((int)(local_60 >> 0x1f) + uVar11) >> 1) + uVar11;
            }
            uVar6 = uVar11 + 1;
            if ((int)(uVar11 + 1) < (int)uVar8) {
              uVar6 = uVar8;
            }
            local_60 = (ulong)uVar6;
            if (GImGui != (ImGuiContext *)0x0) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + 1;
            }
            __dest = (*GImAllocatorAllocFunc)((long)(int)uVar6 << 3,GImAllocatorUserData);
            uVar8 = uVar11;
            pvStack_70 = __dest;
            if (__src != (void *)0x0) {
              memcpy(__dest,__src,(long)(int)uVar11 << 3);
              if (GImGui != (ImGuiContext *)0x0) {
                piVar2 = &(GImGui->IO).MetricsActiveAllocations;
                *piVar2 = *piVar2 + -1;
              }
              (*GImAllocatorFreeFunc)(__src,GImAllocatorUserData);
              uVar8 = local_78;
            }
          }
          *(ImGuiDockNode **)((long)__dest + (long)(int)uVar8 * 8) = src_node;
          uVar8 = local_78 + 1;
          iVar7 = (this->Nodes).Data.Size;
          __src = __dest;
          local_78 = uVar8;
        }
        else {
          pIVar4 = src_node;
          if (src_node->ID != root_id) {
            do {
              pIVar14 = pIVar4;
              pIVar4 = pIVar14->ParentNode;
            } while (pIVar4 != (ImGuiDockNode *)0x0);
            if (pIVar14->ID == root_id) {
              bVar3 = *(byte *)((long)&src_node->LocalFlags + 1);
              lVar9 = (long)(ctx->DockContext).Requests.Size;
              if (0 < lVar9) {
                pIVar5 = (ctx->DockContext).Requests.Data;
                lVar15 = 0;
                do {
                  if (*(ImGuiDockNode **)((long)&pIVar5->DockTargetNode + lVar15) == src_node) {
                    *(undefined4 *)((long)&pIVar5->Type + lVar15) = 0;
                  }
                  lVar15 = lVar15 + 0x40;
                } while (lVar9 * 0x40 != lVar15);
              }
              bVar17 = (bVar3 & 8) >> 3 | bVar17;
              if (root_id != 0) {
                DockNodeMoveWindows(dst_node,src_node);
              }
              goto LAB_00139f31;
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < iVar7);
  }
  if (root_id != 0) {
    *(ushort *)&dst_node->field_0xb8 =
         uVar12 | uVar10 | (ushort)*(undefined4 *)&dst_node->field_0xb8 & 0xffc0;
  }
  p = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
  if (p != (ImGuiWindowSettings *)0x0) {
    p = (ImGuiWindowSettings *)&p->Pos;
  }
  __nmemb = (ulong)uVar8;
  for (; p != (ImGuiWindowSettings *)0x0;
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,p)) {
    if ((p->DockId != 0) && (0 < (int)uVar8)) {
      uVar16 = 0;
      do {
        if (**(ImGuiID **)((long)pvStack_70 + uVar16 * 8) == p->DockId) {
          p->DockId = root_id;
          break;
        }
        uVar16 = uVar16 + 1;
      } while (__nmemb != uVar16);
    }
  }
  if ((int)uVar8 < 2) {
    if (uVar8 != 1) goto LAB_0013a0ee;
  }
  else {
    qsort(pvStack_70,__nmemb,8,DockNodeComparerDepthMostFirst);
  }
  uVar16 = 0;
  do {
    DockContextRemoveNode(ctx,*(ImGuiDockNode **)((long)pvStack_70 + uVar16 * 8),false);
    uVar16 = uVar16 + 1;
  } while (uVar16 < __nmemb);
LAB_0013a0ee:
  if (root_id == 0) {
    ImGuiStorage::Clear(&this->Nodes);
    pIVar5 = (ctx->DockContext).Requests.Data;
    if (pIVar5 != (ImGuiDockRequest *)0x0) {
      (ctx->DockContext).Requests.Size = 0;
      (ctx->DockContext).Requests.Capacity = 0;
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      (ctx->DockContext).Requests.Data = (ImGuiDockRequest *)0x0;
    }
  }
  else if (bVar17 != 0) {
    pbVar1 = (byte *)((long)&dst_node->LocalFlags + 1);
    *pbVar1 = *pbVar1 | 8;
    dst_node->CentralNode = dst_node;
  }
  if (pvStack_70 != (void *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + -1;
    }
    (*GImAllocatorFreeFunc)(pvStack_70,GImAllocatorUserData);
  }
  return;
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}